

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O3

double av1_get_max_bitrate_for_level(AV1_LEVEL level_index,int tier,BITSTREAM_PROFILE profile)

{
  undefined7 in_register_00000039;
  ulong uVar1;
  long lVar2;
  double dVar3;
  
  uVar1 = (ulong)(uint)((int)CONCAT71(in_register_00000039,level_index) * 0x50);
  lVar2 = 0x30;
  if (tier != 0) {
    lVar2 = (ulong)(7 < (&av1_level_defs[0].level)[uVar1]) * 8 + 0x30;
  }
  if (profile == '\0') {
    dVar3 = 1.0;
  }
  else {
    dVar3 = *(double *)(&DAT_004e1470 + (ulong)(profile == '\x01') * 8);
  }
  return *(double *)(&av1_level_defs[0].level + lVar2 + uVar1) * 1000000.0 * dVar3;
}

Assistant:

double av1_get_max_bitrate_for_level(AV1_LEVEL level_index, int tier,
                                     BITSTREAM_PROFILE profile) {
  assert(is_valid_seq_level_idx(level_index));
  return get_max_bitrate(&av1_level_defs[level_index], tier, profile);
}